

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O3

void __thiscall
vkt::sparse::anon_unknown_0::SparseBufferTestInstance::draw
          (SparseBufferTestInstance *this,VkPrimitiveTopology topology,
          VkDescriptorSetLayout descriptorSetLayout,SpecializationMap *specMap)

{
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar1;
  Move<vk::Handle<(vk::HandleType)13>_> *pAttachments;
  VkImageSubresourceRange *pVVar2;
  Move<vk::Handle<(vk::HandleType)14>_> *pMVar3;
  Move<vk::Handle<(vk::HandleType)14>_> *pMVar4;
  Move<vk::Handle<(vk::HandleType)17>_> *pMVar5;
  Move<vk::Handle<(vk::HandleType)23>_> *pMVar6;
  Move<vk::Handle<(vk::HandleType)16>_> *pMVar7;
  Move<vk::Handle<(vk::HandleType)18>_> *pMVar8;
  Move<vk::Handle<(vk::HandleType)24>_> *pMVar9;
  Move<vk::VkCommandBuffer_s_*> *pMVar10;
  deUint32 queueFamilyIndex;
  VkFormat VVar11;
  deUint32 dVar12;
  deUint32 dVar13;
  DeviceDriver *pDVar14;
  VkDevice pVVar15;
  Allocator *allocator;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  deUint64 dVar16;
  VkImage obj;
  Allocation *pAVar17;
  VkImageView obj_00;
  VkShaderModule VVar18;
  VkRenderPass obj_01;
  VkFramebuffer obj_02;
  VkPipelineLayout obj_03;
  VkPipeline obj_04;
  VkCommandPool VVar19;
  VkCommandBuffer_s *pVVar20;
  DeviceInterface *pDVar21;
  VkQueue queue;
  undefined8 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  VkImageSubresourceRange subresourceRange;
  undefined4 uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  undefined8 uVar31;
  VkDevice pVVar32;
  VkCommandPool VVar33;
  Handle<(vk::HandleType)18> HVar34;
  VkAllocationCallbacks *pVVar35;
  Handle<(vk::HandleType)17> HVar36;
  void *pvVar37;
  VkResult result;
  Renderer *pRVar38;
  const_iterator cVar39;
  mapped_type *ppVVar40;
  undefined4 uVar41;
  undefined1 local_468 [16];
  VkDevice local_458;
  VkCommandPool VStack_450;
  undefined8 local_448;
  VkImageCreateInfo *pVStack_440;
  undefined8 local_438;
  VkPipelineShaderStageCreateInfo *local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined4 local_418;
  undefined8 local_414;
  undefined8 uStack_40c;
  undefined4 local_404;
  VkImageCreateInfo imageParams;
  key_type local_2f8;
  key_type local_2d8;
  Move<vk::Handle<(vk::HandleType)18>_> local_2b8;
  Move<vk::Handle<(vk::HandleType)17>_> local_298;
  VkPipelineColorBlendAttachmentState *local_278;
  undefined8 local_270;
  undefined8 uStack_268;
  VkPipelineShaderStageCreateInfo pShaderStages [2];
  UniquePtr<vkt::sparse::(anonymous_namespace)::Renderer,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>_>
  renderer;
  VkAttachmentReference colorAttachmentRef;
  VkPipelineRasterizationStateCreateInfo pipelineRasterizationStateInfo;
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  local_158;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  VkVertexInputAttributeDescription vertexInputAttributeDescription;
  VkRect2D scissor;
  VkViewport res;
  VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkPipelineViewportStateCreateInfo pipelineViewportStateInfo;
  
  pRVar38 = (Renderer *)operator_new(0x198);
  pDVar14 = (this->super_SparseResourcesBaseInstance).m_deviceDriver.
            super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  pVVar15 = (this->super_SparseResourcesBaseInstance).m_logicalDevice.
            super_RefBase<vk::VkDevice_s_*>.m_data.object;
  allocator = (this->super_SparseResourcesBaseInstance).m_allocator.
              super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr;
  queueFamilyIndex = (this->m_universalQueue).queueFamilyIndex;
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             *)((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context)->
               m_progCollection;
  local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d8,"vert","");
  local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"frag","");
  dVar16 = (this->m_colorBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
           m_internal;
  VVar11 = this->m_colorFormat;
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::_Rb_tree(&local_158,&specMap->_M_t);
  (pRVar38->m_colorBuffer).m_internal = dVar16;
  dVar12 = (this->m_renderSize).m_data[0];
  (pRVar38->m_renderSize).m_data[0] = dVar12;
  dVar13 = (this->m_renderSize).m_data[1];
  (pRVar38->m_renderSize).m_data[1] = dVar13;
  pRVar38->m_colorFormat = VVar11;
  (pRVar38->m_colorSubresourceRange).aspectMask = 1;
  (pRVar38->m_colorSubresourceRange).baseMipLevel = 0;
  (pRVar38->m_colorSubresourceRange).levelCount = 1;
  (pRVar38->m_colorSubresourceRange).baseArrayLayer = 0;
  (pRVar38->m_colorSubresourceRange).layerCount = 1;
  (pRVar38->m_clearColor).m_data[0] = 1.0;
  (pRVar38->m_clearColor).m_data[1] = 0.0;
  (pRVar38->m_clearColor).m_data[2] = 0.0;
  (pRVar38->m_clearColor).m_data[3] = 1.0;
  pRVar38->m_topology = topology;
  (pRVar38->m_descriptorSetLayout).m_internal = descriptorSetLayout.m_internal;
  pMVar1 = &pRVar38->m_colorImage;
  pAttachments = &pRVar38->m_colorAttachment;
  pMVar3 = &pRVar38->m_vertexModule;
  pMVar4 = &pRVar38->m_fragmentModule;
  pMVar5 = &pRVar38->m_renderPass;
  pMVar6 = &pRVar38->m_framebuffer;
  pMVar7 = &pRVar38->m_pipelineLayout;
  pMVar8 = &pRVar38->m_pipeline;
  pMVar9 = &pRVar38->m_cmdPool;
  pMVar10 = &pRVar38->m_cmdBuffer;
  (pRVar38->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0
  ;
  (pRVar38->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (pRVar38->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (pRVar38->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (pRVar38->m_colorImageAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
  .m_data.ptr = (Allocation *)0x0;
  memset(pAttachments,0,0x120);
  imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_2D;
  imageParams.extent.depth = 1;
  imageParams.mipLevels = 1;
  imageParams.arrayLayers = 1;
  imageParams.samples = VK_SAMPLE_COUNT_1_BIT;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 0x11;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.queueFamilyIndexCount = 0;
  imageParams.pQueueFamilyIndices = (deUint32 *)0x0;
  imageParams._80_8_ = (ulong)(uint)imageParams._84_4_ << 0x20;
  imageParams.format = VVar11;
  imageParams.extent.width = dVar12;
  imageParams.extent.height = dVar13;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)pShaderStages,
                    &pDVar14->super_DeviceInterface,pVVar15,&imageParams,
                    (VkAllocationCallbacks *)0x0);
  VVar18 = pShaderStages[0].module;
  uVar31 = pShaderStages[0]._16_8_;
  pvVar37 = pShaderStages[0].pNext;
  uVar22 = pShaderStages[0]._0_8_;
  local_458 = (VkDevice)pShaderStages[0]._16_8_;
  VStack_450.m_internal = pShaderStages[0].module.m_internal;
  local_468._0_8_ = pShaderStages[0]._0_8_;
  local_468._8_8_ = pShaderStages[0].pNext;
  pShaderStages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pShaderStages[0]._4_4_ = 0;
  pShaderStages[0].pNext = (void *)0x0;
  pShaderStages[0].flags = 0;
  pShaderStages[0].stage = 0;
  pShaderStages[0].module.m_internal = 0;
  obj.m_internal = (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
  if (obj.m_internal == 0) {
    (pRVar38->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         (VkDevice)uVar31;
    (pRVar38->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)VVar18.m_internal;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal = uVar22;
    (pRVar38->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)pvVar37;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&(pRVar38->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter
               ,obj);
    (pRVar38->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
         local_458;
    (pRVar38->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)VStack_450.m_internal;
    (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal =
         local_468._0_8_;
    (pRVar38->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)local_468._8_8_;
    if (pShaderStages[0]._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&pShaderStages[0].pNext,
                 (VkImage)pShaderStages[0]._0_8_);
    }
  }
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&imageParams,
            &pDVar14->super_DeviceInterface,pVVar15,allocator,
            (VkImage)(pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                     m_internal,(MemoryRequirement)0x0);
  uVar22 = imageParams._0_8_;
  pVVar2 = &pRVar38->m_colorSubresourceRange;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  pAVar17 = (pRVar38->m_colorImageAlloc).
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (pAVar17 != (Allocation *)uVar22) {
    if (pAVar17 == (Allocation *)0x0) {
      (pRVar38->m_colorImageAlloc).
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
           (Allocation *)uVar22;
    }
    else {
      (*pAVar17->_vptr_Allocation[1])();
      (pRVar38->m_colorImageAlloc).
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
           (Allocation *)uVar22;
      if (imageParams._0_8_ != 0) {
        (**(code **)(*(long *)imageParams._0_8_ + 8))();
      }
    }
  }
  uVar23 = (pRVar38->m_colorSubresourceRange).baseArrayLayer;
  uVar28 = pVVar2->aspectMask;
  uVar29 = pVVar2->baseMipLevel;
  uVar30 = pVVar2->levelCount;
  subresourceRange.levelCount = uVar30;
  subresourceRange.baseMipLevel = uVar29;
  subresourceRange.aspectMask = uVar28;
  subresourceRange.baseArrayLayer = uVar23;
  subresourceRange.layerCount = (pRVar38->m_colorSubresourceRange).layerCount;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)local_468,&pDVar14->super_DeviceInterface,
                pVVar15,(VkImage)(pRVar38->m_colorImage).
                                 super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                                 m_internal,VK_IMAGE_VIEW_TYPE_2D,pRVar38->m_colorFormat,
                subresourceRange);
  VVar19.m_internal = VStack_450.m_internal;
  pVVar32 = local_458;
  uVar31 = local_468._8_8_;
  uVar22 = local_468._0_8_;
  imageParams._16_8_ = local_458;
  imageParams.format = (VkFormat)VStack_450.m_internal;
  imageParams.extent.width = (deUint32)(VStack_450.m_internal >> 0x20);
  imageParams._0_8_ = local_468._0_8_;
  imageParams.pNext = (void *)local_468._8_8_;
  local_468._0_8_ = 0;
  local_468._8_8_ = (DeviceInterface *)0x0;
  local_458 = (VkDevice)0x0;
  VStack_450.m_internal = 0;
  obj_00.m_internal =
       (pAttachments->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  if (obj_00.m_internal == 0) {
    (pRVar38->m_colorAttachment).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_device = pVVar32;
    (pRVar38->m_colorAttachment).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)VVar19.m_internal;
    (pAttachments->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal = uVar22
    ;
    (pRVar38->m_colorAttachment).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)uVar31;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(pRVar38->m_colorAttachment).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                deleter,obj_00);
    (pRVar38->m_colorAttachment).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_device = (VkDevice)imageParams._16_8_;
    (pRVar38->m_colorAttachment).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
    (pAttachments->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
         imageParams._0_8_;
    (pRVar38->m_colorAttachment).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)imageParams.pNext;
    if (local_468._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(local_468 + 8),
                 (VkImageView)local_468._0_8_);
    }
  }
  cVar39 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(this_00,&local_2d8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_468,&pDVar14->super_DeviceInterface,
             pVVar15,*(ProgramBinary **)(cVar39._M_node + 2),0);
  VVar19.m_internal = VStack_450.m_internal;
  pVVar32 = local_458;
  uVar31 = local_468._8_8_;
  uVar22 = local_468._0_8_;
  imageParams._16_8_ = local_458;
  imageParams.format = (VkFormat)VStack_450.m_internal;
  imageParams.extent.width = (deUint32)(VStack_450.m_internal >> 0x20);
  imageParams._0_8_ = local_468._0_8_;
  imageParams.pNext = (void *)local_468._8_8_;
  local_468._0_8_ = 0;
  local_468._8_8_ = (DeviceInterface *)0x0;
  local_458 = (VkDevice)0x0;
  VStack_450.m_internal = 0;
  VVar18.m_internal =
       (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
  if (VVar18.m_internal == 0) {
    (pRVar38->m_vertexModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device
         = pVVar32;
    (pRVar38->m_vertexModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)VVar19.m_internal;
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal = uVar22;
    (pRVar38->m_vertexModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)uVar31;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&(pRVar38->m_vertexModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
                deleter,VVar18);
    (pRVar38->m_vertexModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device
         = (VkDevice)imageParams._16_8_;
    (pRVar38->m_vertexModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
    (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
         imageParams._0_8_;
    (pRVar38->m_vertexModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)imageParams.pNext;
    if (local_468._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(local_468 + 8),
                 (VkShaderModule)local_468._0_8_);
    }
  }
  cVar39 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(this_00,&local_2f8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_468,&pDVar14->super_DeviceInterface,
             pVVar15,*(ProgramBinary **)(cVar39._M_node + 2),0);
  VVar19.m_internal = VStack_450.m_internal;
  pVVar32 = local_458;
  uVar31 = local_468._8_8_;
  uVar22 = local_468._0_8_;
  imageParams._16_8_ = local_458;
  imageParams.format = (VkFormat)VStack_450.m_internal;
  imageParams.extent.width = (deUint32)(VStack_450.m_internal >> 0x20);
  imageParams._0_8_ = local_468._0_8_;
  imageParams.pNext = (void *)local_468._8_8_;
  local_468._0_8_ = 0;
  local_468._8_8_ = (DeviceInterface *)0x0;
  local_458 = (VkDevice)0x0;
  VStack_450.m_internal = 0;
  VVar18.m_internal =
       (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
  if (VVar18.m_internal == 0) {
    (pRVar38->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_device = pVVar32;
    (pRVar38->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)VVar19.m_internal;
    (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal = uVar22;
    (pRVar38->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)uVar31;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&(pRVar38->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
                deleter,VVar18);
    (pRVar38->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_device = (VkDevice)imageParams._16_8_;
    (pRVar38->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
    (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
         imageParams._0_8_;
    (pRVar38->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)imageParams.pNext;
    if (local_468._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(local_468 + 8),
                 (VkShaderModule)local_468._0_8_);
    }
  }
  pShaderStages[0].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  pShaderStages[0].pNext = (void *)0x0;
  pShaderStages[0].flags = 0;
  pShaderStages[0].stage = VK_SHADER_STAGE_VERTEX_BIT;
  pShaderStages[0].module.m_internal =
       (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
  pShaderStages[0].pName = "main";
  imageParams.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  ppVVar40 = std::
             map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
             ::operator[]((map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
                           *)&local_158,&imageParams.sType);
  pShaderStages[0].pSpecializationInfo = *ppVVar40;
  pShaderStages[1].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  pShaderStages[1].pNext = (void *)0x0;
  pShaderStages[1].flags = 0;
  pShaderStages[1].stage = VK_SHADER_STAGE_FRAGMENT_BIT;
  pShaderStages[1].module.m_internal =
       (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
  pShaderStages[1].pName = "main";
  local_468._0_4_ = VK_SHADER_STAGE_FRAGMENT_BIT;
  ppVVar40 = std::
             map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
             ::operator[]((map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
                           *)&local_158,(key_type *)local_468);
  pShaderStages[1].pSpecializationInfo = *ppVVar40;
  pipelineRasterizationStateInfo._0_8_ = (ulong)pRVar38->m_colorFormat << 0x20;
  pipelineRasterizationStateInfo.pNext = (void *)0x100000001;
  pipelineRasterizationStateInfo.flags = 0;
  pipelineRasterizationStateInfo.depthClampEnable = 2;
  pipelineRasterizationStateInfo.rasterizerDiscardEnable = 1;
  pipelineRasterizationStateInfo.polygonMode = VK_POLYGON_MODE_FILL;
  pipelineRasterizationStateInfo.cullMode = 2;
  imageParams.extent._4_8_ = &colorAttachmentRef;
  colorAttachmentRef.attachment = 0;
  colorAttachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.extent.width = 0;
  imageParams.mipLevels = 0;
  imageParams.arrayLayers = 0;
  imageParams.queueFamilyIndexCount = 0;
  imageParams._68_4_ = 0;
  imageParams.samples = 0;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 0;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.format = VK_FORMAT_R4G4_UNORM_PACK8;
  local_468._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  local_468._8_8_ = (DeviceInterface *)0x0;
  local_458 = (VkDevice)0x100000000;
  local_448._0_4_ = 1;
  local_438 = (ulong)local_438._4_4_ << 0x20;
  local_430 = (VkPipelineShaderStageCreateInfo *)0x0;
  VStack_450.m_internal = (deUint64)&pipelineRasterizationStateInfo;
  pVStack_440 = &imageParams;
  ::vk::createRenderPass
            (&local_298,&pDVar14->super_DeviceInterface,pVVar15,(VkRenderPassCreateInfo *)local_468,
             (VkAllocationCallbacks *)0x0);
  pVVar35 = local_298.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator;
  pVVar32 = local_298.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  pDVar21 = local_298.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  HVar36.m_internal =
       local_298.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  imageParams._16_8_ =
       local_298.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  imageParams.format =
       (VkFormat)local_298.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator
  ;
  imageParams.extent.width =
       (deUint32)
       ((ulong)local_298.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator
       >> 0x20);
  imageParams._0_8_ =
       local_298.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  imageParams.pNext =
       local_298.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  local_298.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
  local_298.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_298.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_298.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_01.m_internal =
       (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal;
  if (obj_01.m_internal == 0) {
    (pRVar38->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
         pVVar32;
    (pRVar38->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
    m_allocator = pVVar35;
    (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
         HVar36.m_internal;
    (pRVar38->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
    m_deviceIface = pDVar21;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&(pRVar38->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                deleter,obj_01);
    (pRVar38->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
         (VkDevice)imageParams._16_8_;
    (pRVar38->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
    (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)17>_>).m_data.object.m_internal =
         imageParams._0_8_;
    (pRVar38->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)imageParams.pNext;
    if (local_298.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
                (&local_298.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
                 (VkRenderPass)
                 local_298.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal);
    }
  }
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)local_468,&pDVar14->super_DeviceInterface
                  ,pVVar15,(VkRenderPass)
                           (pRVar38->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.
                           m_data.object.m_internal,1,(VkImageView *)pAttachments,
                  (pRVar38->m_renderSize).m_data[0],(pRVar38->m_renderSize).m_data[1],1);
  VVar19.m_internal = VStack_450.m_internal;
  pVVar32 = local_458;
  uVar31 = local_468._8_8_;
  uVar22 = local_468._0_8_;
  imageParams._16_8_ = local_458;
  imageParams.format = (VkFormat)VStack_450.m_internal;
  imageParams.extent.width = (deUint32)(VStack_450.m_internal >> 0x20);
  imageParams._0_8_ = local_468._0_8_;
  imageParams.pNext = (void *)local_468._8_8_;
  local_468._0_8_ = 0;
  local_468._8_8_ = (DeviceInterface *)0x0;
  local_458 = (VkDevice)0x0;
  VStack_450.m_internal = 0;
  obj_02.m_internal =
       (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object.m_internal;
  if (obj_02.m_internal == 0) {
    (pRVar38->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device
         = pVVar32;
    (pRVar38->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)VVar19.m_internal;
    (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object.m_internal = uVar22;
    (pRVar38->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)uVar31;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&(pRVar38->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.
                deleter,obj_02);
    (pRVar38->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device
         = (VkDevice)imageParams._16_8_;
    (pRVar38->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
    (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)23>_>).m_data.object.m_internal =
         imageParams._0_8_;
    (pRVar38->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)imageParams.pNext;
    if (local_468._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(local_468 + 8),
                 (VkFramebuffer)local_468._0_8_);
    }
  }
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)local_468,
                     &pDVar14->super_DeviceInterface,pVVar15,
                     (VkDescriptorSetLayout)(pRVar38->m_descriptorSetLayout).m_internal);
  VVar19.m_internal = VStack_450.m_internal;
  pVVar32 = local_458;
  uVar31 = local_468._8_8_;
  uVar22 = local_468._0_8_;
  imageParams._16_8_ = local_458;
  imageParams.format = (VkFormat)VStack_450.m_internal;
  imageParams.extent.width = (deUint32)(VStack_450.m_internal >> 0x20);
  imageParams._0_8_ = local_468._0_8_;
  imageParams.pNext = (void *)local_468._8_8_;
  local_468._0_8_ = 0;
  local_468._8_8_ = (DeviceInterface *)0x0;
  local_458 = (VkDevice)0x0;
  VStack_450.m_internal = 0;
  obj_03.m_internal =
       (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal;
  if (obj_03.m_internal == 0) {
    (pRVar38->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_device = pVVar32;
    (pRVar38->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)VVar19.m_internal;
    (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal = uVar22;
    (pRVar38->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)uVar31;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&(pRVar38->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                deleter,obj_03);
    (pRVar38->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_device = (VkDevice)imageParams._16_8_;
    (pRVar38->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_allocator = (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
    (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal =
         imageParams._0_8_;
    (pRVar38->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)imageParams.pNext;
    if (local_468._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)16>_> *)(local_468 + 8),
                 (VkPipelineLayout)local_468._0_8_);
    }
  }
  vertexInputBindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  vertexInputBindingDescription.binding = 0;
  vertexInputBindingDescription.stride = 0x10;
  colorAttachmentRef.attachment = 0x13;
  imageParams._40_8_ = &pipelineInputAssemblyStateInfo;
  pipelineInputAssemblyStateInfo.pNext = (void *)0x0;
  pipelineInputAssemblyStateInfo.primitiveRestartEnable = 0;
  pipelineInputAssemblyStateInfo._28_4_ = 0;
  pipelineInputAssemblyStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO
  ;
  pipelineInputAssemblyStateInfo._4_4_ = 0;
  pipelineInputAssemblyStateInfo._16_8_ = (ulong)pRVar38->m_topology << 0x20;
  pipelineViewportStateInfo.pViewports = &res;
  scissor.extent = *(VkExtent2D *)(pRVar38->m_renderSize).m_data;
  res.width = (float)(int)scissor.extent.width;
  res.height = (float)(int)scissor.extent.height;
  res.x = 0.0;
  res.y = 0.0;
  res.minDepth = 0.0;
  res.maxDepth = 1.0;
  pipelineViewportStateInfo.pScissors = &scissor;
  scissor.offset.x = 0;
  scissor.offset.y = 0;
  imageParams._56_8_ = &pipelineViewportStateInfo;
  pipelineViewportStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  pipelineViewportStateInfo.pNext = (void *)0x0;
  pipelineViewportStateInfo.flags = 0;
  pipelineViewportStateInfo.viewportCount = 1;
  pipelineViewportStateInfo.scissorCount = 1;
  pipelineRasterizationStateInfo.pNext = (void *)0x0;
  pipelineRasterizationStateInfo.depthBiasClamp = 0.0;
  pipelineRasterizationStateInfo.depthBiasSlopeFactor = 0.0;
  pipelineRasterizationStateInfo.cullMode = 0;
  pipelineRasterizationStateInfo.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  pipelineRasterizationStateInfo.depthBiasEnable = 0;
  pipelineRasterizationStateInfo.depthBiasConstantFactor = 0.0;
  pipelineRasterizationStateInfo.flags = 0;
  pipelineRasterizationStateInfo.depthClampEnable = 0;
  pipelineRasterizationStateInfo.rasterizerDiscardEnable = 0;
  pipelineRasterizationStateInfo.polygonMode = VK_POLYGON_MODE_FILL;
  pipelineRasterizationStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  pipelineRasterizationStateInfo._4_4_ = 0;
  imageParams.pQueueFamilyIndices = &pipelineMultisampleStateInfo.sType;
  pipelineMultisampleStateInfo.pNext = (void *)0x0;
  pipelineMultisampleStateInfo.sampleShadingEnable = 0;
  pipelineMultisampleStateInfo.minSampleShading = 0.0;
  pipelineMultisampleStateInfo.pSampleMask = (VkSampleMask *)0x0;
  pipelineMultisampleStateInfo.alphaToCoverageEnable = 0;
  pipelineMultisampleStateInfo.alphaToOneEnable = 0;
  pipelineMultisampleStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  pipelineMultisampleStateInfo._4_4_ = 0;
  pipelineMultisampleStateInfo.flags = 0;
  pipelineMultisampleStateInfo.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  local_468._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  local_468._8_8_ = (DeviceInterface *)0x0;
  local_458 = (VkDevice)0x0;
  VStack_450.m_internal = 0x100000000;
  local_438._0_4_ = 0;
  local_438._4_4_ = 7;
  pipelineRasterizationStateInfo.lineWidth = 1.0;
  pipelineRasterizationStateInfo._60_4_ = 0;
  local_448._0_4_ = 0;
  local_448._4_4_ = 0;
  pVStack_440 = (VkImageCreateInfo *)0x0;
  local_430 = (VkPipelineShaderStageCreateInfo *)0x0;
  uStack_428 = 0;
  local_420 = 0;
  local_418 = 7;
  local_414 = 0;
  uStack_40c = 0;
  local_404 = 0x3f800000;
  local_298.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._0_4_ = 0x1a;
  local_298.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_298.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_298.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x100000003;
  local_278 = &pipelineColorBlendAttachmentState;
  pipelineColorBlendAttachmentState.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  pipelineColorBlendAttachmentState.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineColorBlendAttachmentState.alphaBlendOp = VK_BLEND_OP_ADD;
  pipelineColorBlendAttachmentState.colorWriteMask = 0xf;
  pipelineColorBlendAttachmentState.blendEnable = 0;
  pipelineColorBlendAttachmentState.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
  pipelineColorBlendAttachmentState.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineColorBlendAttachmentState.colorBlendOp = VK_BLEND_OP_ADD;
  imageParams.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_3D;
  imageParams._24_8_ = pShaderStages;
  imageParams.extent._4_8_ = &colorAttachmentRef;
  imageParams.samples = 0;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_270 = 0;
  uStack_268 = 0;
  imageParams._80_8_ = (Move<vk::Handle<(vk::HandleType)16>_> *)local_468;
  imageParams._64_8_ = &pipelineRasterizationStateInfo;
  ::vk::createGraphicsPipeline
            (&local_2b8,&pDVar14->super_DeviceInterface,pVVar15,(VkPipelineCache)0x0,
             (VkGraphicsPipelineCreateInfo *)&imageParams,(VkAllocationCallbacks *)0x0);
  pVVar35 = local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator;
  pVVar32 = local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  pDVar21 = local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  HVar34.m_internal =
       local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  imageParams._16_8_ =
       local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  imageParams.format =
       (VkFormat)local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
  ;
  imageParams.extent.width =
       (deUint32)
       ((ulong)local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
       >> 0x20);
  imageParams._0_8_ =
       local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  imageParams.pNext =
       local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_04.m_internal =
       (pMVar8->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal;
  if (obj_04.m_internal == 0) {
    (pRVar38->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
         pVVar32;
    (pRVar38->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
         = pVVar35;
    (pMVar8->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
         HVar34.m_internal;
    (pRVar38->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
    m_deviceIface = pDVar21;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&(pRVar38->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               obj_04);
    (pRVar38->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
         (VkDevice)imageParams._16_8_;
    (pRVar38->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
    (pMVar8->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
         imageParams._0_8_;
    (pRVar38->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)imageParams.pNext;
    if (local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
                (&local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
                 (VkPipeline)
                 local_2b8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
    }
  }
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)local_468,&pDVar14->super_DeviceInterface
                  ,pVVar15,queueFamilyIndex);
  VVar33.m_internal = VStack_450.m_internal;
  pVVar32 = local_458;
  uVar31 = local_468._8_8_;
  uVar22 = local_468._0_8_;
  imageParams._16_8_ = local_458;
  imageParams.format = (VkFormat)VStack_450.m_internal;
  imageParams.extent.width = (deUint32)(VStack_450.m_internal >> 0x20);
  imageParams._0_8_ = local_468._0_8_;
  imageParams.pNext = (void *)local_468._8_8_;
  local_468._0_8_ = (VkCommandBuffer_s *)0x0;
  local_468._8_8_ = (DeviceInterface *)0x0;
  local_458 = (VkDevice)0x0;
  VStack_450.m_internal = 0;
  VVar19.m_internal =
       (pMVar9->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal;
  if (VVar19.m_internal == 0) {
    (pRVar38->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
         pVVar32;
    (pRVar38->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)VVar33.m_internal;
    (pMVar9->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal = uVar22;
    (pRVar38->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)uVar31;
  }
  else {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&(pRVar38->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               VVar19);
    (pRVar38->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
         (VkDevice)imageParams._16_8_;
    (pRVar38->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
    (pMVar9->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal =
         imageParams._0_8_;
    (pRVar38->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)imageParams.pNext;
    if (local_468._0_8_ != 0) {
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                ((Deleter<vk::Handle<(vk::HandleType)24>_> *)(local_468 + 8),
                 (VkCommandPool)local_468._0_8_);
    }
  }
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_468,&pDVar14->super_DeviceInterface,pVVar15,
             (VkCommandPool)
             (pMVar9->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  VVar19.m_internal = VStack_450.m_internal;
  pVVar15 = local_458;
  uVar31 = local_468._8_8_;
  uVar22 = local_468._0_8_;
  imageParams._16_8_ = local_458;
  imageParams.format = (VkFormat)VStack_450.m_internal;
  imageParams.extent.width = VStack_450.m_internal._4_4_;
  imageParams._0_8_ = local_468._0_8_;
  imageParams.pNext = (void *)local_468._8_8_;
  local_468._0_8_ = 0;
  local_468._8_8_ = (DeviceInterface *)0x0;
  local_458 = (VkDevice)0x0;
  VStack_450.m_internal = 0;
  pVVar20 = (pMVar10->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object;
  if (pVVar20 == (VkCommandBuffer_s *)0x0) {
    (pRVar38->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = pVVar15;
    (pRVar38->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
         VVar19.m_internal;
    (pMVar10->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object = (VkCommandBuffer_s *)uVar22;
    (pRVar38->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)uVar31;
  }
  else {
    pDVar21 = (pRVar38->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
              m_deviceIface;
    pipelineRasterizationStateInfo._0_8_ = pVVar20;
    (*pDVar21->_vptr_DeviceInterface[0x48])
              (pDVar21,(pRVar38->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                       m_device,
               (pRVar38->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
               m_internal);
    *(VkImageCreateFlags *)
     &(pRVar38->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
         imageParams.flags;
    *(VkImageType *)
     ((long)&(pRVar38->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device +
     4) = imageParams.imageType;
    *(VkFormat *)
     &(pRVar38->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal
         = imageParams.format;
    *(deUint32 *)
     ((long)&(pRVar38->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
             m_internal + 4) = imageParams.extent.width;
    (pMVar10->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object =
         (VkCommandBuffer_s *)imageParams._0_8_;
    (pRVar38->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)imageParams.pNext;
    if (local_468._0_8_ != 0) {
      imageParams._0_8_ = local_468._0_8_;
      (*(*(_func_int ***)local_468._8_8_)[0x48])(local_468._8_8_,local_458,VStack_450.m_internal);
    }
  }
  renderer.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::Renderer,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>_>
  .m_data.ptr = pRVar38;
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::~_Rb_tree(&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
    operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
    operator_delete(local_2d8._M_dataplus._M_p,local_2d8.field_2._M_allocated_capacity + 1);
  }
  pDVar14 = (this->super_SparseResourcesBaseInstance).m_deviceDriver.
            super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  pVVar15 = (this->super_SparseResourcesBaseInstance).m_logicalDevice.
            super_RefBase<vk::VkDevice_s_*>.m_data.object;
  queue = (this->m_universalQueue).queueHandle;
  beginCommandBuffer(&pDVar14->super_DeviceInterface,
                     (pMVar10->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  pShaderStages[0].sType = (VkStructureType)(pRVar38->m_clearColor).m_data[0];
  pShaderStages[0]._4_4_ = (pRVar38->m_clearColor).m_data[1];
  pShaderStages[0].pNext = *(void **)((pRVar38->m_clearColor).m_data + 2);
  pVStack_440 = *(VkImageCreateInfo **)(pRVar38->m_renderSize).m_data;
  local_468._0_4_ = 0x2b;
  local_468._8_8_ = (DeviceInterface *)0x0;
  local_458 = (VkDevice)
              (pRVar38->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
              m_internal;
  VStack_450.m_internal =
       (pRVar38->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
       m_internal;
  local_448._0_4_ = 0;
  local_448._4_4_ = 0;
  local_438._0_4_ = 1;
  local_430 = pShaderStages;
  (*(pDVar14->super_DeviceInterface)._vptr_DeviceInterface[0x74])
            (pDVar14,(pRVar38->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             local_468,0);
  (*(pDVar14->super_DeviceInterface)._vptr_DeviceInterface[0x4c])
            (pDVar14,(pMVar10->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0,
             (pMVar8->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal);
  (*(this->super_Delegate)._vptr_Delegate[2])
            (&this->super_Delegate,
             (pMVar7->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal,
             (pMVar10->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  (*(pDVar14->super_DeviceInterface)._vptr_DeviceInterface[0x76])
            (pDVar14,(pMVar10->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0x100;
  imageParams.imageType = 0x800;
  imageParams.format = VK_FORMAT_R4G4B4A4_UNORM_PACK16;
  imageParams.extent.width = 6;
  imageParams.extent.height = 0xffffffff;
  imageParams.extent.depth = 0xffffffff;
  dVar16 = (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
  imageParams.mipLevels = (deUint32)dVar16;
  imageParams.arrayLayers = (deUint32)(dVar16 >> 0x20);
  uVar24 = pVVar2->aspectMask;
  uVar25 = pVVar2->baseMipLevel;
  uVar26 = (pRVar38->m_colorSubresourceRange).levelCount;
  uVar27 = (pRVar38->m_colorSubresourceRange).baseArrayLayer;
  imageParams.queueFamilyIndexCount = (pRVar38->m_colorSubresourceRange).layerCount;
  uVar41 = SUB84((VkGraphicsPipelineCreateInfo *)&imageParams,0);
  imageParams.samples = uVar24;
  imageParams.tiling = uVar25;
  imageParams.usage = uVar26;
  imageParams.sharingMode = uVar27;
  (*(pDVar14->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
            (pDVar14,(pMVar10->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0x400,0x1000,0,
             0,0,0,0,1,uVar41);
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 1;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 1;
  imageParams.extent.height = 0;
  imageParams.extent.depth = 0;
  imageParams.mipLevels = 0;
  uVar22 = *(undefined8 *)(pRVar38->m_renderSize).m_data;
  imageParams.arrayLayers = (deUint32)uVar22;
  imageParams.samples = (VkSampleCountFlagBits)((ulong)uVar22 >> 0x20);
  imageParams.tiling = VK_IMAGE_TILING_LINEAR;
  (*(pDVar14->super_DeviceInterface)._vptr_DeviceInterface[99])
            (pDVar14,(pRVar38->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (pRVar38->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,6,(pRVar38->m_colorBuffer).m_internal,1,uVar41);
  imageParams.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0x1000;
  imageParams.imageType = 0x2000;
  imageParams.format = ~VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0xffffffff;
  dVar16 = (pRVar38->m_colorBuffer).m_internal;
  imageParams.extent.height = (deUint32)dVar16;
  imageParams.extent.depth = (deUint32)(dVar16 >> 0x20);
  imageParams.mipLevels = 0;
  imageParams.arrayLayers = 0;
  imageParams.samples = 0xffffffff;
  imageParams.tiling = ~VK_IMAGE_TILING_OPTIMAL;
  (*(pDVar14->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
            (pDVar14,(pRVar38->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             0x1000,0x4000,0,0,0,1,uVar41,0,0);
  result = (*(pDVar14->super_DeviceInterface)._vptr_DeviceInterface[0x4a])
                     (pDVar14,(pMVar10->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  ::vk::checkResult(result,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferTests.cpp"
                    ,0x29c);
  submitCommandsAndWait
            (&pDVar14->super_DeviceInterface,pVVar15,queue,
             (pMVar10->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0,(VkSemaphore *)0x0,
             (VkPipelineStageFlags *)0x0,0,(VkSemaphore *)0x0);
  de::details::
  UniqueBase<vkt::sparse::(anonymous_namespace)::Renderer,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>_>
  ::~UniqueBase(&renderer.
                 super_UniqueBase<vkt::sparse::(anonymous_namespace)::Renderer,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>_>
               );
  return;
}

Assistant:

void draw (const VkPrimitiveTopology	topology,
			   const VkDescriptorSetLayout	descriptorSetLayout	= DE_NULL,
			   Renderer::SpecializationMap	specMap				= Renderer::SpecializationMap())
	{
		const UniquePtr<Renderer> renderer(new Renderer(
			getDeviceInterface(), getDevice(), getAllocator(), m_universalQueue.queueFamilyIndex, descriptorSetLayout,
			m_context.getBinaryCollection(), "vert", "frag", *m_colorBuffer, m_renderSize, m_colorFormat, Vec4(1.0f, 0.0f, 0.0f, 1.0f), topology, specMap));

		renderer->draw(getDeviceInterface(), getDevice(), m_universalQueue.queueHandle, *this);
	}